

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32c_test.cc
# Opt level: O3

void __thiscall leveldb::crc32c::CRC_StandardResults_Test::TestBody(CRC_StandardResults_Test *this)

{
  int line;
  undefined8 *puVar1;
  char *pcVar2;
  uint8_t data [48];
  char buf [32];
  AssertHelper local_90;
  Message local_88;
  undefined8 *local_80;
  undefined8 local_78;
  undefined8 *puStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  AssertHelper local_40;
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  local_28 = (undefined1  [16])0x0;
  local_38 = (undefined1  [16])0x0;
  local_88.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0x8a9136aa;
  local_90.data_._0_4_ = Extend(0,local_38,0x20);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_78,"0x8a9136aa","Value(buf, sizeof(buf))",(uint *)&local_88,
             (uint *)&local_90);
  puVar1 = puStack_70;
  if (local_78._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_88);
    if (puStack_70 == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)*puStack_70;
    }
    line = 0x11;
  }
  else {
    if (puStack_70 != (undefined8 *)0x0) {
      if ((undefined8 *)*puStack_70 != puStack_70 + 2) {
        operator_delete((undefined8 *)*puStack_70);
      }
      operator_delete(puVar1);
    }
    local_38._8_4_ = 0xffffffff;
    local_38._0_8_ = 0xffffffffffffffff;
    local_38._12_4_ = 0xffffffff;
    local_28._8_4_ = 0xffffffff;
    local_28._0_8_ = 0xffffffffffffffff;
    local_28._12_4_ = 0xffffffff;
    local_88.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 0x62a8ab43;
    local_90.data_._0_4_ = Extend(0,local_38,0x20);
    testing::internal::CmpHelperEQ<int,unsigned_int>
              ((internal *)&local_78,"0x62a8ab43","Value(buf, sizeof(buf))",(int *)&local_88,
               (uint *)&local_90);
    puVar1 = puStack_70;
    if (local_78._0_1_ == (internal)0x0) {
      testing::Message::Message(&local_88);
      if (puStack_70 == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (char *)*puStack_70;
      }
      line = 0x14;
    }
    else {
      if (puStack_70 != (undefined8 *)0x0) {
        if ((undefined8 *)*puStack_70 != puStack_70 + 2) {
          operator_delete((undefined8 *)*puStack_70);
        }
        operator_delete(puVar1);
      }
      local_38._8_8_ = 0xf0e0d0c0b0a0908;
      local_38._0_8_ = 0x706050403020100;
      local_28._8_8_ = 0x1f1e1d1c1b1a1918;
      local_28._0_8_ = 0x1716151413121110;
      local_88.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = 0x46dd794e;
      local_90.data_._0_4_ = Extend(0,local_38,0x20);
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)&local_78,"0x46dd794e","Value(buf, sizeof(buf))",(int *)&local_88,
                 (uint *)&local_90);
      puVar1 = puStack_70;
      if (local_78._0_1_ == (internal)0x0) {
        testing::Message::Message(&local_88);
        if (puStack_70 == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = (char *)*puStack_70;
        }
        line = 0x19;
      }
      else {
        if (puStack_70 != (undefined8 *)0x0) {
          if ((undefined8 *)*puStack_70 != puStack_70 + 2) {
            operator_delete((undefined8 *)*puStack_70);
          }
          operator_delete(puVar1);
        }
        local_38._8_8_ = 0x1011121314151617;
        local_38._0_8_ = 0x18191a1b1c1d1e1f;
        local_28._8_8_ = 0x1020304050607;
        local_28._0_8_ = 0x8090a0b0c0d0e0f;
        local_88.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ = 0x113fdb5c;
        local_90.data_._0_4_ = Extend(0,local_38,0x20);
        testing::internal::CmpHelperEQ<int,unsigned_int>
                  ((internal *)&local_78,"0x113fdb5c","Value(buf, sizeof(buf))",(int *)&local_88,
                   (uint *)&local_90);
        if (local_78._0_1_ != (internal)0x0) {
          if (puStack_70 != (undefined8 *)0x0) {
            if ((undefined8 *)*puStack_70 != puStack_70 + 2) {
              operator_delete((undefined8 *)*puStack_70);
            }
            operator_delete(puStack_70);
          }
          local_58 = 0x28;
          uStack_50 = 2;
          local_68 = 0x4000000000014;
          uStack_60 = 0x1800000014000000;
          local_78 = 0xc001;
          puStack_70 = (undefined8 *)0x0;
          local_90.data_._0_4_ = 0xd9963a56;
          local_40.data_._0_4_ = Extend(0,(char *)&local_78,0x30);
          testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                    ((internal *)&local_88,"0xd9963a56",
                     "Value(reinterpret_cast<char*>(data), sizeof(data))",(uint *)&local_90,
                     (uint *)&local_40);
          puVar1 = local_80;
          if (local_88.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_90);
            if (local_80 == (undefined8 *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = (char *)*local_80;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_40,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/crc32c_test.cc"
                       ,0x26,pcVar2);
            testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_90);
            testing::internal::AssertHelper::~AssertHelper(&local_40);
            puVar1 = local_80;
            if ((long *)CONCAT44(local_90.data_._4_4_,(uint32_t)local_90.data_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_90.data_._4_4_,(uint32_t)local_90.data_) + 8))();
              puVar1 = local_80;
            }
          }
          goto LAB_00107b8d;
        }
        testing::Message::Message(&local_88);
        if (puStack_70 == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = (char *)*puStack_70;
        }
        line = 0x1e;
      }
    }
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_90,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/crc32c_test.cc"
             ,line,pcVar2);
  testing::internal::AssertHelper::operator=(&local_90,&local_88);
  testing::internal::AssertHelper::~AssertHelper(&local_90);
  puVar1 = puStack_70;
  if ((long *)CONCAT44(local_88.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._4_4_,
                       local_88.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_88.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._4_4_,
                                   local_88.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._0_4_) + 8))();
    puVar1 = puStack_70;
  }
LAB_00107b8d:
  if (puVar1 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar1 != puVar1 + 2) {
      operator_delete((undefined8 *)*puVar1);
    }
    operator_delete(puVar1);
  }
  return;
}

Assistant:

TEST(CRC, StandardResults) {
  // From rfc3720 section B.4.
  char buf[32];

  memset(buf, 0, sizeof(buf));
  ASSERT_EQ(0x8a9136aa, Value(buf, sizeof(buf)));

  memset(buf, 0xff, sizeof(buf));
  ASSERT_EQ(0x62a8ab43, Value(buf, sizeof(buf)));

  for (int i = 0; i < 32; i++) {
    buf[i] = i;
  }
  ASSERT_EQ(0x46dd794e, Value(buf, sizeof(buf)));

  for (int i = 0; i < 32; i++) {
    buf[i] = 31 - i;
  }
  ASSERT_EQ(0x113fdb5c, Value(buf, sizeof(buf)));

  uint8_t data[48] = {
      0x01, 0xc0, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
      0x00, 0x00, 0x00, 0x00, 0x14, 0x00, 0x00, 0x00, 0x00, 0x00, 0x04, 0x00,
      0x00, 0x00, 0x00, 0x14, 0x00, 0x00, 0x00, 0x18, 0x28, 0x00, 0x00, 0x00,
      0x00, 0x00, 0x00, 0x00, 0x02, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
  };
  ASSERT_EQ(0xd9963a56, Value(reinterpret_cast<char*>(data), sizeof(data)));
}